

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O0

float operator~(vec_3d *a)

{
  vec_3d *in_RDI;
  float fVar1;
  float result;
  
  fVar1 = operator*(in_RDI,in_RDI);
  fVar1 = sqrtf(fVar1);
  return fVar1;
}

Assistant:

float operator~(const vec_3d &a) {
    float result = a * a;
#ifdef LIBQUAT_ARM
    arm_sqrt_f32(&result, result);
#else
    result = sqrtf(result);
#endif

    return result;
}